

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

HashElem * findElementWithHash(Hash *pH,char *pKey,uint *pHash)

{
  byte bVar1;
  HashElem *pHVar2;
  ulong uVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  Hash *pHVar7;
  long lVar8;
  byte bVar9;
  
  if (pH->ht == (_ht *)0x0) {
    pHVar7 = (Hash *)&pH->count;
    uVar4 = 0;
  }
  else {
    bVar9 = *pKey;
    if (bVar9 == 0) {
      uVar4 = 0;
    }
    else {
      pbVar5 = (byte *)(pKey + 1);
      uVar4 = 0;
      do {
        uVar4 = (""[bVar9] + uVar4) * -0x61c8864f;
        bVar9 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar9 != 0);
    }
    uVar3 = (ulong)uVar4 % (ulong)pH->htsize;
    uVar4 = (uint)uVar3;
    pH = (Hash *)(pH->ht + uVar3);
    pHVar7 = pH;
  }
  uVar6 = pHVar7->htsize;
  pHVar2 = pH->first;
  if (pHash != (uint *)0x0) {
    *pHash = uVar4;
  }
joined_r0x0015c13f:
  if (uVar6 == 0) {
    return &findElementWithHash::nullElement;
  }
  lVar8 = 0;
  do {
    bVar9 = pHVar2->pKey[lVar8];
    bVar1 = pKey[lVar8];
    if (bVar9 == bVar1) {
      if ((ulong)bVar9 == 0) break;
    }
    else if (""[bVar9] != ""[bVar1]) break;
    lVar8 = lVar8 + 1;
  } while( true );
  if (bVar9 == bVar1) {
    return pHVar2;
  }
  pHVar2 = pHVar2->next;
  uVar6 = uVar6 - 1;
  goto joined_r0x0015c13f;
}

Assistant:

static HashElem *findElementWithHash(
  const Hash *pH,     /* The pH to be searched */
  const char *pKey,   /* The key we are searching for */
  unsigned int *pHash /* Write the hash value here */
){
  HashElem *elem;                /* Used to loop thru the element list */
  unsigned int count;            /* Number of elements left to test */
  unsigned int h;                /* The computed hash */
  static HashElem nullElement = { 0, 0, 0, 0 };

  if( pH->ht ){   /*OPTIMIZATION-IF-TRUE*/
    struct _ht *pEntry;
    h = strHash(pKey) % pH->htsize;
    pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
  }else{
    h = 0;
    elem = pH->first;
    count = pH->count;
  }
  if( pHash ) *pHash = h;
  while( count ){
    assert( elem!=0 );
    if( sqlite3StrICmp(elem->pKey,pKey)==0 ){
      return elem;
    }
    elem = elem->next;
    count--;
  }
  return &nullElement;
}